

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

offset_t LdConfigDirWrapper::_getFieldDelta(bool is32b,size_t fId)

{
  offset_t local_1a0;
  offset_t local_198;
  offset_t local_190;
  offset_t local_188;
  offset_t local_180;
  offset_t local_178;
  offset_t local_170;
  offset_t local_168;
  offset_t local_160;
  offset_t local_158;
  offset_t local_150;
  offset_t local_148;
  offset_t local_140;
  offset_t local_138;
  offset_t local_130;
  offset_t local_128;
  offset_t local_120;
  offset_t local_118;
  offset_t local_110;
  offset_t local_108;
  offset_t local_100;
  offset_t local_f8;
  offset_t local_f0;
  offset_t local_e8;
  offset_t local_e0;
  offset_t local_d8;
  offset_t local_d0;
  offset_t local_c8;
  offset_t local_c0;
  offset_t local_b8;
  offset_t local_b0;
  offset_t local_a8;
  offset_t local_a0;
  offset_t local_98;
  offset_t local_90;
  offset_t local_88;
  offset_t local_80;
  offset_t local_78;
  offset_t local_70;
  offset_t local_20;
  offset_t fieldOffset;
  size_t fId_local;
  bool is32b_local;
  
  local_20 = 0xffffffffffffffff;
  switch(fId) {
  case 0:
    local_20 = 0;
    break;
  case 1:
    local_20 = 4;
    break;
  case 2:
    local_20 = 8;
    break;
  case 3:
    local_20 = 10;
    break;
  case 4:
    local_20 = 0xc;
    break;
  case 5:
    local_20 = 0x10;
    break;
  case 6:
    local_20 = 0x14;
    break;
  case 7:
    local_20 = 0x18;
    break;
  case 8:
    if (is32b) {
      local_70 = 0x1c;
    }
    else {
      local_70 = 0x20;
    }
    local_20 = local_70;
    break;
  case 9:
    if (is32b) {
      local_78 = 0x20;
    }
    else {
      local_78 = 0x28;
    }
    local_20 = local_78;
    break;
  case 10:
    if (is32b) {
      local_80 = 0x24;
    }
    else {
      local_80 = 0x30;
    }
    local_20 = local_80;
    break;
  case 0xb:
    if (is32b) {
      local_88 = 0x28;
    }
    else {
      local_88 = 0x38;
    }
    local_20 = local_88;
    break;
  case 0xc:
    if (is32b) {
      local_90 = 0x2c;
    }
    else {
      local_90 = 0x40;
    }
    local_20 = local_90;
    break;
  case 0xd:
    if (is32b) {
      local_98 = 0x30;
    }
    else {
      local_98 = 0x48;
    }
    local_20 = local_98;
    break;
  case 0xe:
    if (is32b) {
      local_a0 = 0x34;
    }
    else {
      local_a0 = 0x4c;
    }
    local_20 = local_a0;
    break;
  case 0xf:
    if (is32b) {
      local_a8 = 0x36;
    }
    else {
      local_a8 = 0x4e;
    }
    local_20 = local_a8;
    break;
  case 0x10:
    if (is32b) {
      local_b0 = 0x38;
    }
    else {
      local_b0 = 0x50;
    }
    local_20 = local_b0;
    break;
  case 0x11:
    if (is32b) {
      local_b8 = 0x3c;
    }
    else {
      local_b8 = 0x58;
    }
    local_20 = local_b8;
    break;
  case 0x12:
    if (is32b) {
      local_c0 = 0x40;
    }
    else {
      local_c0 = 0x60;
    }
    local_20 = local_c0;
    break;
  case 0x13:
    if (is32b) {
      local_c8 = 0x44;
    }
    else {
      local_c8 = 0x68;
    }
    local_20 = local_c8;
    break;
  case 0x14:
    if (is32b) {
      local_d0 = 0x48;
    }
    else {
      local_d0 = 0x70;
    }
    local_20 = local_d0;
    break;
  case 0x15:
    if (is32b) {
      local_d8 = 0x4c;
    }
    else {
      local_d8 = 0x78;
    }
    local_20 = local_d8;
    break;
  case 0x16:
    if (is32b) {
      local_e0 = 0x50;
    }
    else {
      local_e0 = 0x80;
    }
    local_20 = local_e0;
    break;
  case 0x17:
    if (is32b) {
      local_e8 = 0x54;
    }
    else {
      local_e8 = 0x88;
    }
    local_20 = local_e8;
    break;
  case 0x18:
    if (is32b) {
      local_f0 = 0x58;
    }
    else {
      local_f0 = 0x90;
    }
    local_20 = local_f0;
    break;
  case 0x19:
    if (is32b) {
      local_f8 = 0x5c;
    }
    else {
      local_f8 = 0x94;
    }
    local_20 = local_f8;
    break;
  case 0x1a:
    if (is32b) {
      local_100 = 0x5e;
    }
    else {
      local_100 = 0x96;
    }
    local_20 = local_100;
    break;
  case 0x1b:
    if (is32b) {
      local_108 = 0x60;
    }
    else {
      local_108 = 0x98;
    }
    local_20 = local_108;
    break;
  case 0x1c:
    if (is32b) {
      local_110 = 100;
    }
    else {
      local_110 = 0x9c;
    }
    local_20 = local_110;
    break;
  case 0x1d:
    if (is32b) {
      local_118 = 0x68;
    }
    else {
      local_118 = 0xa0;
    }
    local_20 = local_118;
    break;
  case 0x1e:
    if (is32b) {
      local_120 = 0x6c;
    }
    else {
      local_120 = 0xa8;
    }
    local_20 = local_120;
    break;
  case 0x1f:
    if (is32b) {
      local_128 = 0x70;
    }
    else {
      local_128 = 0xb0;
    }
    local_20 = local_128;
    break;
  case 0x20:
    if (is32b) {
      local_130 = 0x74;
    }
    else {
      local_130 = 0xb8;
    }
    local_20 = local_130;
    break;
  case 0x21:
    if (is32b) {
      local_138 = 0x78;
    }
    else {
      local_138 = 0xc0;
    }
    local_20 = local_138;
    break;
  case 0x22:
    if (is32b) {
      local_140 = 0x7c;
    }
    else {
      local_140 = 200;
    }
    local_20 = local_140;
    break;
  case 0x23:
    if (is32b) {
      local_148 = 0x80;
    }
    else {
      local_148 = 0xd0;
    }
    local_20 = local_148;
    break;
  case 0x24:
    if (is32b) {
      local_150 = 0x84;
    }
    else {
      local_150 = 0xd8;
    }
    local_20 = local_150;
    break;
  case 0x25:
    if (is32b) {
      local_158 = 0x88;
    }
    else {
      local_158 = 0xe0;
    }
    local_20 = local_158;
    break;
  case 0x26:
    if (is32b) {
      local_160 = 0x8c;
    }
    else {
      local_160 = 0xe4;
    }
    local_20 = local_160;
    break;
  case 0x27:
    if (is32b) {
      local_168 = 0x8e;
    }
    else {
      local_168 = 0xe6;
    }
    local_20 = local_168;
    break;
  case 0x28:
    if (is32b) {
      local_170 = 0x90;
    }
    else {
      local_170 = 0xe8;
    }
    local_20 = local_170;
    break;
  case 0x29:
    if (is32b) {
      local_178 = 0x94;
    }
    else {
      local_178 = 0xf0;
    }
    local_20 = local_178;
    break;
  case 0x2a:
    if (is32b) {
      local_180 = 0x98;
    }
    else {
      local_180 = 0xf4;
    }
    local_20 = local_180;
    break;
  case 0x2b:
    if (is32b) {
      local_188 = 0x9c;
    }
    else {
      local_188 = 0xf8;
    }
    local_20 = local_188;
    break;
  case 0x2c:
    if (is32b) {
      local_190 = 0xa0;
    }
    else {
      local_190 = 0x100;
    }
    local_20 = local_190;
    break;
  case 0x2d:
    if (is32b) {
      local_198 = 0xa4;
    }
    else {
      local_198 = 0x108;
    }
    local_20 = local_198;
    break;
  case 0x2e:
    if (is32b) {
      local_1a0 = 0xa8;
    }
    else {
      local_1a0 = 0x110;
    }
    local_20 = local_1a0;
  }
  return local_20;
}

Assistant:

offset_t  LdConfigDirWrapper::_getFieldDelta(bool is32b, size_t fId)
{
    static pe::IMAGE_LOAD_CONFIG_DIRECTORY32 ld32 = { 0 };
    static pe::IMAGE_LOAD_CONFIG_DIRECTORY64 ld64 = { 0 };

    //offset from the beginning of the IMAGE_LOAD_CONFIG_DIRECTORY_T strucure
    offset_t fieldOffset = INVALID_ADDR;
    switch (fId) {
        case SIZE : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, Size) : getStructFieldOffset(ld64, Size);
            break;
        case TIMEST : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32,TimeDateStamp) : getStructFieldOffset(ld64, TimeDateStamp);
            break;
        case MAJOR_VER :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32,MajorVersion) : getStructFieldOffset(ld64, MajorVersion);
            break;
        case MINOR_VER : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, MinorVersion) : getStructFieldOffset(ld64, MinorVersion);
            break;
        case GLOBAL_FLAGS_CLEAR : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GlobalFlagsClear) : getStructFieldOffset(ld64, GlobalFlagsClear);
            break;
        case GLOBAL_FLAGS_SET : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GlobalFlagsSet) : getStructFieldOffset(ld64, GlobalFlagsSet);
            break;
        case CRITICAT_SEC_TIMEOUT : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CriticalSectionDefaultTimeout) : getStructFieldOffset(ld64, CriticalSectionDefaultTimeout);
            break;
        case DECOMMIT_FREE : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DeCommitFreeBlockThreshold) : getStructFieldOffset(ld64, DeCommitFreeBlockThreshold);
            break;

        case DECOMMIT_TOTAL : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DeCommitTotalFreeThreshold) : getStructFieldOffset(ld64, DeCommitTotalFreeThreshold);
            break;
        case LOCK_PREFIX : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, LockPrefixTable) : getStructFieldOffset(ld64, LockPrefixTable);
            break;
        case MAX_ALLOC : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, MaximumAllocationSize) : getStructFieldOffset(ld64, MaximumAllocationSize);
            break;
        case VIRTUAL_MEM : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, VirtualMemoryThreshold) : getStructFieldOffset(ld64, VirtualMemoryThreshold);
            break;
        case PROC_HEAP_FLAGS32 : //PROC_AFF_MASK64
        {
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, ProcessHeapFlags) : getStructFieldOffset(ld64, ProcessAffinityMask);
            break;
        }
        case PROC_AFF_MASK32 : // PROC_HEAP_FLAGS64
        {
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, ProcessAffinityMask) : getStructFieldOffset(ld64, ProcessHeapFlags);
            break;
        }
        case CSD_VER : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CSDVersion) : getStructFieldOffset(ld64, CSDVersion);
            break;
        case DEPENDENT_LOAD_FLAGS : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DependentLoadFlags) : getStructFieldOffset(ld64, DependentLoadFlags);
            break;
        case EDIT_LIST :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, EditList) : getStructFieldOffset(ld64, EditList);
            break;
        case SEC_COOKIE :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, SecurityCookie) : getStructFieldOffset(ld64, SecurityCookie);
            break;
        case SEH_TABLE :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, SEHandlerTable) : getStructFieldOffset(ld64, SEHandlerTable);
            break;
        case SEH_COUNT :
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, SEHandlerCount) : getStructFieldOffset(ld64, SEHandlerCount);
            break;

        // W8.1 part:
        case GUARD_CHECK : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFCheckFunctionPointer) : getStructFieldOffset(ld64, GuardCFCheckFunctionPointer);
            break;
        case GUARD_DISPATCH : 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFDispatchFunctionPointer) : getStructFieldOffset(ld64, GuardCFDispatchFunctionPointer);
            break;
        case GUARD_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFFunctionTable) : getStructFieldOffset(ld64, GuardCFFunctionTable);
            break;
        case GUARD_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardCFFunctionCount) : getStructFieldOffset(ld64, GuardCFFunctionCount);
            break;
        case GUARD_FLAGS: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardFlags) : getStructFieldOffset(ld64, GuardFlags);
            break;

        // W10 part:
        case CODE_INTEGRITY_FLAGS: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.Flags) : getStructFieldOffset(ld64, CodeIntegrity.Flags);
            break;
        case CODE_INTEGRITY_CATALOG: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.Catalog) : getStructFieldOffset(ld64, CodeIntegrity.Catalog);
            break;
        case CODE_INTEGRITY_CATALOG_OFFSET:  
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.CatalogOffset) : getStructFieldOffset(ld64, CodeIntegrity.CatalogOffset);
            break;
        case CODE_INTEGRITY_RESERVED: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CodeIntegrity.Reserved) : getStructFieldOffset(ld64, CodeIntegrity.Reserved);
            break;
        case GUARD_ADDR_IAT_ENTRY_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardAddressTakenIatEntryTable) : getStructFieldOffset(ld64, GuardAddressTakenIatEntryTable);
            break;
        case GUARD_ADDR_IAT_ENTRY_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardAddressTakenIatEntryCount) : getStructFieldOffset(ld64, GuardAddressTakenIatEntryCount);
            break;
        case GUARD_LONG_JUMP_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardLongJumpTargetTable) : getStructFieldOffset(ld64, GuardLongJumpTargetTable);
            break;
        case GUARD_LONG_JUMP_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardLongJumpTargetCount) : getStructFieldOffset(ld64, GuardLongJumpTargetCount);
            break;
        case DYNAMIC_VAL_RELOC:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DynamicValueRelocTable) : getStructFieldOffset(ld64, DynamicValueRelocTable);
            break;
        case CHPE_METADATA_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, CHPEMetadataPointer) : getStructFieldOffset(ld64, CHPEMetadataPointer);
            break;
        case GUARD_FAILURE_ROUTINE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardRFFailureRoutine) : getStructFieldOffset(ld64, GuardRFFailureRoutine);
            break;
        case GUARD_FAILURE_ROUTINE_FUNC_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardRFFailureRoutineFunctionPointer) : getStructFieldOffset(ld64, GuardRFFailureRoutineFunctionPointer);
            break;
        case DYNAMIC_VAL_RELOC_TABLE_OFFSET: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DynamicValueRelocTableOffset) : getStructFieldOffset(ld64, DynamicValueRelocTableOffset);
            break;
        case DYNAMIC_VAL_RELOC_TABLE_SECTION:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, DynamicValueRelocTableSection) : getStructFieldOffset(ld64, DynamicValueRelocTableSection);
            break;
        case RESERVED2: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, Reserved2) : getStructFieldOffset(ld64, Reserved2);
            break;
        case GUARD_VERIFY_STACK_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardRFVerifyStackPointerFunctionPointer) : getStructFieldOffset(ld64, GuardRFVerifyStackPointerFunctionPointer);
            break;
        case HOT_PATCH_TABLE_OFFSET: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, HotPatchTableOffset) : getStructFieldOffset(ld64, HotPatchTableOffset);
            break;
        case RESERVED3:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, Reserved3) : getStructFieldOffset(ld64, Reserved3);
            break;
        case ENCLAVE_CONFIG_PTR:
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, EnclaveConfigurationPointer) : getStructFieldOffset(ld64, EnclaveConfigurationPointer);
            break;
        case VOLATILE_METADATA_PTR: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, VolatileMetadataPointer) : getStructFieldOffset(ld64, VolatileMetadataPointer);
            break;
        case GUARD_EH_CONT_TABLE: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardEHContinuationTable) : getStructFieldOffset(ld64, GuardEHContinuationTable);
            break;
        case GUARD_EH_CONT_COUNT: 
            fieldOffset = (is32b) ? getStructFieldOffset(ld32, GuardEHContinuationCount) : getStructFieldOffset(ld64, GuardEHContinuationCount);
            break;
    }
    return fieldOffset;
}